

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::ArrayBuilder<kj::String>::clear(ArrayBuilder<kj::String> *this)

{
  RemoveConst<kj::String> *pRVar1;
  ArrayBuilder<kj::String> *this_local;
  
  while (this->ptr < this->pos) {
    pRVar1 = this->pos;
    this->pos = pRVar1 + -1;
    dtor<kj::String>(pRVar1 + -1);
  }
  return;
}

Assistant:

void clear() {
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(ptr);
    } else {
      while (pos > ptr) {
        kj::dtor(*--pos);
      }
    }
  }